

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O2

char * add_option_to_json(char *root_options,char *new_option_name,char *new_value_string,
                         int new_value_int)

{
  json_t *json;
  json_t *value;
  char *pcVar1;
  
  json = get_root_option_json_object(root_options);
  if (json != (json_t *)0x0) {
    if (new_value_string == (char *)0x0) {
      value = json_integer((long)new_value_int);
    }
    else {
      value = json_string(new_value_string);
    }
    if (value != (json_t *)0x0) {
      json_object_set_new(json,new_option_name,value);
      pcVar1 = json_dumps(json,0);
      json_decref(json);
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

static char * add_option_to_json(const char * root_options, const char * new_option_name, const char * new_value_string, int new_value_int)
{
	json_t * root, *temp;
	char * ret;

	root = get_root_option_json_object(root_options);
	if (!root)
		return NULL;

	//Add the new item
	if (new_value_string) {
		ADD_STRING(temp, new_value_string, root, new_option_name);
	} else {
		ADD_INT(temp, new_value_int, root, new_option_name);
	}

	ret = json_dumps(root, 0);
	json_decref(root);
	return ret;
}